

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prof.c
# Opt level: O0

void duckdb_je_prof_dump_hook_set(prof_dump_hook_t hook)

{
  prof_dump_hook_t hook_local;
  
  duckdb_je_prof_dump_hook.repr = hook;
  return;
}

Assistant:

void
prof_dump_hook_set(prof_dump_hook_t hook) {
	atomic_store_p(&prof_dump_hook, hook, ATOMIC_RELEASE);
}